

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall
xmrig::MinerPrivate::getHashrate(MinerPrivate *this,Value *reply,Document *doc,int version)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  int iVar1;
  undefined4 extraout_var;
  size_t threadId;
  pointer ppIVar2;
  double dVar3;
  Value thread;
  Value total;
  Value hashrate;
  Value threads;
  Data local_c8;
  double local_b8;
  double local_b0;
  double local_a8;
  int local_9c;
  Data local_98;
  Data local_88;
  Data local_78;
  Value *local_68;
  MinerPrivate *local_60;
  pointer local_58;
  double local_50;
  double local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  Hashrate *this_00;
  
  allocator = doc->allocator_;
  local_88.n = (Number)0x0;
  local_88.s.str = (Ch *)0x3000000000000;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x4000000000000;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)0x4000000000000;
  ppIVar2 = (this->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = (this->backends).
             super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_68 = reply;
  local_60 = this;
  if (ppIVar2 == local_58) {
    local_b8 = 0.0;
    local_b0 = 0.0;
    local_a8 = 0.0;
  }
  else {
    local_a8 = 0.0;
    local_b0 = 0.0;
    local_b8 = 0.0;
    local_9c = version;
    do {
      iVar1 = (*(*ppIVar2)->_vptr_IBackend[4])();
      this_00 = (Hashrate *)CONCAT44(extraout_var,iVar1);
      if (this_00 != (Hashrate *)0x0) {
        local_48 = Hashrate::calc(this_00,10000);
        local_50 = Hashrate::calc(this_00,60000);
        dVar3 = Hashrate::calc(this_00,900000);
        local_a8 = local_a8 + local_48;
        local_b0 = local_b0 + local_50;
        local_b8 = local_b8 + dVar3;
        if ((version < 2) && (this_00->m_threads != 0)) {
          threadId = 0;
          do {
            local_c8.n.i64 = (Number)0x0;
            local_c8.s.str = (Ch *)0x4000000000000;
            dVar3 = Hashrate::calc(this_00,threadId,10000);
            Hashrate::normalize((Hashrate *)&local_40,dVar3);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_c8.s,&local_40,allocator);
            dVar3 = Hashrate::calc(this_00,threadId,60000);
            Hashrate::normalize((Hashrate *)&local_40,dVar3);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_c8.s,&local_40,allocator);
            dVar3 = Hashrate::calc(this_00,threadId,900000);
            Hashrate::normalize((Hashrate *)&local_40,dVar3);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_c8.s,&local_40,allocator);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_78.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_c8.s,allocator);
            threadId = threadId + 1;
            version = local_9c;
          } while (threadId < this_00->m_threads);
        }
      }
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 != local_58);
  }
  Hashrate::normalize((Hashrate *)&local_c8.s,local_a8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_98.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_c8.s,allocator);
  Hashrate::normalize((Hashrate *)&local_c8.s,local_b0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_98.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_c8.s,allocator);
  Hashrate::normalize((Hashrate *)&local_c8.s,local_b8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_98.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_c8.s,allocator);
  local_c8.s.str = (Ch *)0x40500000018db62;
  local_c8.n = (Number)0x5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,allocator);
  Hashrate::normalize((Hashrate *)&local_40,local_60->maxHashrate);
  local_c8.s.str = (Ch *)0x40500000018d927;
  local_c8.n = (Number)0x7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,&local_40,allocator);
  if (version == 1) {
    local_c8.s.str = (Ch *)0x40500000018829c;
    local_c8.n = (Number)0x7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,allocator);
  }
  local_c8.s.str = (Ch *)0x40500000018ba66;
  local_c8.n = (Number)0x8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_68,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,allocator);
  return;
}

Assistant:

void getHashrate(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        Value hashrate(kObjectType);
        Value total(kArrayType);
        Value threads(kArrayType);

        double t[3] = { 0.0 };

        for (IBackend *backend : backends) {
            const Hashrate *hr = backend->hashrate();
            if (!hr) {
                continue;
            }

            t[0] += hr->calc(Hashrate::ShortInterval);
            t[1] += hr->calc(Hashrate::MediumInterval);
            t[2] += hr->calc(Hashrate::LargeInterval);

            if (version > 1) {
                continue;
            }

            for (size_t i = 0; i < hr->threads(); i++) {
                Value thread(kArrayType);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::ShortInterval)),  allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::MediumInterval)), allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::LargeInterval)),  allocator);

                threads.PushBack(thread, allocator);
            }
        }

        total.PushBack(Hashrate::normalize(t[0]),  allocator);
        total.PushBack(Hashrate::normalize(t[1]), allocator);
        total.PushBack(Hashrate::normalize(t[2]),  allocator);

        hashrate.AddMember("total",   total, allocator);
        hashrate.AddMember("highest", Hashrate::normalize(maxHashrate), allocator);

        if (version == 1) {
            hashrate.AddMember("threads", threads, allocator);
        }

        reply.AddMember("hashrate", hashrate, allocator);
    }